

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::parse_request_line(Server *this,char *s,Request *req)

{
  ulong uVar1;
  pointer pcVar2;
  char *b;
  int iVar3;
  size_t sVar4;
  const_iterator cVar5;
  undefined8 uVar6;
  ulong uVar7;
  long *plVar8;
  long lVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  size_t count;
  allocator_type local_1aa;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1a9;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  sVar4 = strlen(s);
  if (((1 < sVar4) && (s[sVar4 - 2] == '\r')) && (s[sVar4 - 1] == '\n')) {
    local_168._M_dataplus._M_p = (pointer)0x0;
    pcStack_170 = std::
                  _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:5775:36)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:5775:36)>
                ::_M_manager;
    local_188._M_unused._M_object = &local_168;
    local_188._8_8_ = req;
    detail::split(s,s + (sVar4 - 2),' ',(function<void_(const_char_*,_const_char_*)> *)&local_188);
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x3) {
      if ((parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_ == '\0') &&
         (iVar3 = __cxa_guard_acquire(&parse_request_line(char_const*,httplib::Request&)::
                                       methods_abi_cxx11_), iVar3 != 0)) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"GET","");
        local_148[0] = local_138;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"HEAD","");
        local_128[0] = local_118;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"POST","");
        local_108[0] = local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"PUT","");
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"DELETE","");
        local_c8[0] = local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"CONNECT","");
        local_a8[0] = local_98;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"OPTIONS","");
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"TRACE","");
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"PATCH","");
        plVar8 = local_38;
        local_48[0] = plVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"PRI","");
        __l._M_len = 10;
        __l._M_array = &local_168;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,__l,&local_1a9,
              &local_1aa);
        lVar9 = -0x140;
        do {
          if (plVar8 != (long *)plVar8[-2]) {
            operator_delete((long *)plVar8[-2],*plVar8 + 1);
          }
          plVar8 = plVar8 + -4;
          lVar9 = lVar9 + 0x20;
        } while (lVar9 != 0);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_);
      }
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_._M_t,
                     &req->method);
      if ((_Rb_tree_header *)cVar5._M_node !=
          &parse_request_line(char_const*,httplib::Request&)::methods_abi_cxx11_._M_t._M_impl.
           super__Rb_tree_header) {
        iVar3 = std::__cxx11::string::compare((char *)&req->version);
        if ((iVar3 == 0) ||
           (iVar3 = std::__cxx11::string::compare((char *)&req->version), iVar3 == 0)) {
          uVar1 = (req->target)._M_string_length;
          if (uVar1 != 0) {
            pcVar2 = (req->target)._M_dataplus._M_p;
            uVar7 = 0;
            do {
              if (pcVar2[uVar7] == '#') {
                if (uVar1 < uVar7) {
                  uVar6 = std::__throw_out_of_range_fmt
                                    ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                     "basic_string::erase");
                  parse_request_line();
                  __cxa_guard_abort(&parse_request_line(char_const*,httplib::Request&)::
                                     methods_abi_cxx11_);
                  _Unwind_Resume(uVar6);
                }
                (req->target)._M_string_length = uVar7;
                pcVar2[uVar7] = '\0';
                break;
              }
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
          }
          local_168._M_dataplus._M_p = (pointer)0x0;
          b = (req->target)._M_dataplus._M_p;
          pcStack_190 = std::
                        _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:5808:19)>
                        ::_M_invoke;
          local_198 = std::
                      _Function_handler<void_(const_char_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/examples/server/httplib.h:5808:19)>
                      ::_M_manager;
          local_1a8._M_unused._M_object = &local_168;
          local_1a8._8_8_ = req;
          detail::split(b,b + (req->target)._M_string_length,'?',
                        (function<void_(const_char_*,_const_char_*)> *)&local_1a8);
          if (local_198 != (code *)0x0) {
            (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
          }
          return local_168._M_dataplus._M_p < (pointer)0x3;
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool Server::parse_request_line(const char *s, Request &req) {
  auto len = strlen(s);
  if (len < 2 || s[len - 2] != '\r' || s[len - 1] != '\n') { return false; }
  len -= 2;

  {
    size_t count = 0;

    detail::split(s, s + len, ' ', [&](const char *b, const char *e) {
      switch (count) {
      case 0: req.method = std::string(b, e); break;
      case 1: req.target = std::string(b, e); break;
      case 2: req.version = std::string(b, e); break;
      default: break;
      }
      count++;
    });

    if (count != 3) { return false; }
  }

  static const std::set<std::string> methods{
      "GET",     "HEAD",    "POST",  "PUT",   "DELETE",
      "CONNECT", "OPTIONS", "TRACE", "PATCH", "PRI"};

  if (methods.find(req.method) == methods.end()) { return false; }

  if (req.version != "HTTP/1.1" && req.version != "HTTP/1.0") { return false; }

  {
    // Skip URL fragment
    for (size_t i = 0; i < req.target.size(); i++) {
      if (req.target[i] == '#') {
        req.target.erase(i);
        break;
      }
    }

    size_t count = 0;

    detail::split(req.target.data(), req.target.data() + req.target.size(), '?',
                  [&](const char *b, const char *e) {
                    switch (count) {
                    case 0:
                      req.path = detail::decode_url(std::string(b, e), false);
                      break;
                    case 1: {
                      if (e - b > 0) {
                        detail::parse_query_text(std::string(b, e), req.params);
                      }
                      break;
                    }
                    default: break;
                    }
                    count++;
                  });

    if (count > 2) { return false; }
  }

  return true;
}